

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O1

void jsgf_rhs_free(jsgf_rhs_t *rhs)

{
  glist_t pgVar1;
  
  if (rhs != (jsgf_rhs_t *)0x0) {
    jsgf_rhs_free(rhs->alt);
    for (pgVar1 = rhs->atoms; pgVar1 != (glist_t)0x0; pgVar1 = pgVar1->next) {
      jsgf_atom_free((jsgf_atom_t *)(pgVar1->data).ptr);
    }
    glist_free(rhs->atoms);
    ckd_free(rhs);
    return;
  }
  return;
}

Assistant:

static void
jsgf_rhs_free(jsgf_rhs_t * rhs)
{
    gnode_t *gn;

    if (rhs == NULL)
        return;

    jsgf_rhs_free(rhs->alt);
    for (gn = rhs->atoms; gn; gn = gnode_next(gn))
        jsgf_atom_free(gnode_ptr(gn));
    glist_free(rhs->atoms);
    ckd_free(rhs);
}